

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::auxIsTree(Graph *this,Vertex *v,int *markeds,bool *isCycle)

{
  Edge *pEVar1;
  
  if (v != (Vertex *)0x0) {
    if (v->marked == false) {
      v->marked = true;
      *markeds = *markeds + 1;
      for (pEVar1 = v->edgesList; pEVar1 != (Edge *)0x0; pEVar1 = pEVar1->nextEdge) {
        if (pEVar1->closed != false) {
          auxIsTree(this,pEVar1->destiny,markeds,isCycle);
        }
      }
    }
    else {
      *isCycle = true;
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n No NULL \n",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return;
}

Assistant:

void Graph::auxIsTree(Vertex *v, int &markeds, bool &isCycle){
    if(v == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        if(v->getMarked() == false){
            v->setMarked(true);
            markeds++;

            for(Edge *a= v->getEdgesList(); a!=NULL; a= a->getNext()){

                //nao descer por arcos com chave aberta
                while(a!=NULL && a->isClosed() == false){
                    a = a->getNext();
                }

                if(a==NULL)
                    break;

                auxIsTree(a->getDestiny(), markeds, isCycle);
            }
        }
        else
            isCycle = true;
    }
}